

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  int iVar1;
  bool bVar2;
  ostream *this_00;
  long lVar3;
  char *pcVar4;
  ostringstream os;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar2 = true;
  lVar3 = 0;
  do {
    if (lVar3 == 0xc) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      return __return_storage_ptr__;
    }
    if (!bVar2) {
      std::operator<<((ostream *)local_1a8,"_");
    }
    iVar1 = *(int *)((long)this->numSamples + lVar3);
    pcVar4 = "none";
    if (iVar1 == -2) {
LAB_011225b2:
      std::operator<<((ostream *)local_1a8,pcVar4);
    }
    else {
      if (iVar1 == -1) {
        pcVar4 = "tex";
        goto LAB_011225b2;
      }
      this_00 = std::operator<<((ostream *)local_1a8,"rbo");
      std::ostream::operator<<(this_00,*(int *)((long)this->numSamples + lVar3));
    }
    lVar3 = lVar3 + 4;
    bVar2 = false;
  } while( true );
}

Assistant:

string NumSamplesParams::getName (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	for (const GLsizei* ns	=	DE_ARRAY_BEGIN(params.numSamples);
		 ns					!=	DE_ARRAY_END(params.numSamples);
		 ns++)
	{
		if (first)
			first = false;
		else
			os << "_";

		if (*ns == SAMPLES_NONE)
			os << "none";
		else if (*ns == SAMPLES_TEXTURE)
			os << "tex";
		else
			os << "rbo" << *ns;
	}
	return os.str();
}